

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::message_verify::test_method(message_verify *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined4 local_158;
  MessageVerificationResult local_154;
  lazy_ostream local_150;
  undefined1 *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined4 *local_110;
  undefined **local_108;
  undefined1 local_100;
  undefined1 *local_f8;
  undefined4 **local_f0;
  MessageVerificationResult *local_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined1 *local_d0;
  MessageVerificationResult **local_c8;
  char *local_c0;
  char *local_b8;
  assertion_result local_b0;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x66a;
  file.m_begin = (iterator)&local_120;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_130,msg);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"invalid address","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"signature should be irrelevant","");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"message too","");
  local_154 = MessageVerify(&local_58,&local_78,&local_98);
  local_e8 = &local_154;
  local_110 = &local_158;
  local_158 = 0;
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_154 == ERR_INVALID_ADDRESS);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8 = "";
  local_c8 = &local_e8;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0138e7d0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_110;
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_0138e7d0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_150,1,2,REQUIRE,0xf51989,(size_t)&local_c0,0x66a,&local_e0,
             "MessageVerificationResult::ERR_INVALID_ADDRESS",&local_108);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x671;
  file_00.m_begin = (iterator)&local_168;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
             msg_00);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"3B5fQsEXEaV8v6U3ejYc8XaKXAkyQj2MjV","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"signature should be irrelevant","");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"message too","");
  local_154 = MessageVerify(&local_58,&local_78,&local_98);
  local_158 = 1;
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_154 == ERR_ADDRESS_NO_KEY);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8 = "";
  local_e8 = &local_154;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0138e7d0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_e8;
  local_110 = &local_158;
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_0138e7d0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_110;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_150,1,2,REQUIRE,0xf51a2e,(size_t)&local_c0,0x671,&local_e0,
             "MessageVerificationResult::ERR_ADDRESS_NO_KEY",&local_108);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x678;
  file_01.m_begin = (iterator)&local_188;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_198,
             msg_01);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"1KqbBpLy5FARmTPD4VZnDDpYjkUvkr82Pm","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"invalid signature, not in base64 encoding","");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"message should be irrelevant","");
  local_154 = MessageVerify(&local_58,&local_78,&local_98);
  local_158 = 2;
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_154 == ERR_MALFORMED_SIGNATURE);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8 = "";
  local_e8 = &local_154;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0138e7d0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_e8;
  local_110 = &local_158;
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_0138e7d0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_110;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_150,1,2,REQUIRE,0xf51b2c,(size_t)&local_c0,0x678,&local_e0,
             "MessageVerificationResult::ERR_MALFORMED_SIGNATURE",&local_108);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x67f;
  file_02.m_begin = (iterator)&local_1a8;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b8,
             msg_02);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"1KqbBpLy5FARmTPD4VZnDDpYjkUvkr82Pm","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA="
             ,"");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"message should be irrelevant","");
  local_154 = MessageVerify(&local_58,&local_78,&local_98);
  local_158 = 3;
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_154 == ERR_PUBKEY_NOT_RECOVERED);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8 = "";
  local_e8 = &local_154;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0138e7d0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_e8;
  local_110 = &local_158;
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_0138e7d0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_110;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_150,1,2,REQUIRE,0xf51c3a,(size_t)&local_c0,0x67f,&local_e0,
             "MessageVerificationResult::ERR_PUBKEY_NOT_RECOVERED",&local_108);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x686;
  file_03.m_begin = (iterator)&local_1c8;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1d8,
             msg_03);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk="
             ,"");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"I never signed this","");
  local_154 = MessageVerify(&local_58,&local_78,&local_98);
  local_158 = 4;
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_154 == ERR_NOT_SIGNED);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8 = "";
  local_e8 = &local_154;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0138e7d0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_e8;
  local_110 = &local_158;
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_0138e7d0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_110;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_150,1,2,REQUIRE,0xf51d56,(size_t)&local_c0,0x686,&local_e0,
             "MessageVerificationResult::ERR_NOT_SIGNED",&local_108);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x68d;
  file_04.m_begin = (iterator)&local_1e8;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1f8,
             msg_04);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk="
             ,"");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Trust no one","");
  local_154 = MessageVerify(&local_58,&local_78,&local_98);
  local_158 = 5;
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_154 == OK);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8 = "";
  local_e8 = &local_154;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0138e7d0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_e8;
  local_110 = &local_158;
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_0138e7d0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_110;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_150,1,2,REQUIRE,0xf51e28,(size_t)&local_c0,0x68d,&local_e0,
             "MessageVerificationResult::OK",&local_108);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x694;
  file_05.m_begin = (iterator)&local_208;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_218,
             msg_05);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"11canuhp9X2NocwCq7xNrQYTmUgZAnLK3","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "IIcaIENoYW5jZWxsb3Igb24gYnJpbmsgb2Ygc2Vjb25kIGJhaWxvdXQgZm9yIGJhbmtzIAaHRtbCeDZINyavx14="
             ,"");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Trust me","");
  local_154 = MessageVerify(&local_58,&local_78,&local_98);
  local_158 = 5;
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_154 == OK);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8 = "";
  local_e8 = &local_154;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0138e7d0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_e8;
  local_110 = &local_158;
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_0138e7d0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_110;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_150,1,2,REQUIRE,0xf51f6b,(size_t)&local_c0,0x694,&local_e0,
             "MessageVerificationResult::OK",&local_108);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(message_verify)
{
    BOOST_CHECK_EQUAL(
        MessageVerify(
            "invalid address",
            "signature should be irrelevant",
            "message too"),
        MessageVerificationResult::ERR_INVALID_ADDRESS);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "3B5fQsEXEaV8v6U3ejYc8XaKXAkyQj2MjV",
            "signature should be irrelevant",
            "message too"),
        MessageVerificationResult::ERR_ADDRESS_NO_KEY);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "1KqbBpLy5FARmTPD4VZnDDpYjkUvkr82Pm",
            "invalid signature, not in base64 encoding",
            "message should be irrelevant"),
        MessageVerificationResult::ERR_MALFORMED_SIGNATURE);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "1KqbBpLy5FARmTPD4VZnDDpYjkUvkr82Pm",
            "AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA=",
            "message should be irrelevant"),
        MessageVerificationResult::ERR_PUBKEY_NOT_RECOVERED);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs",
            "IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk=",
            "I never signed this"),
        MessageVerificationResult::ERR_NOT_SIGNED);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs",
            "IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk=",
            "Trust no one"),
        MessageVerificationResult::OK);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "11canuhp9X2NocwCq7xNrQYTmUgZAnLK3",
            "IIcaIENoYW5jZWxsb3Igb24gYnJpbmsgb2Ygc2Vjb25kIGJhaWxvdXQgZm9yIGJhbmtzIAaHRtbCeDZINyavx14=",
            "Trust me"),
        MessageVerificationResult::OK);
}